

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManDupHashMapping(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_01;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  int local_38;
  int local_34;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMapping;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar4 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar4;
    Gia_ManHashAlloc(p_00);
    Gia_ManFillValue(p);
    pGVar5 = Gia_ManConst0(p);
    pGVar5->Value = 0;
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar8 = false;
      if (local_34 < iVar1) {
        pFanin = Gia_ManCi(p,local_34);
        bVar8 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pFanin->Value = uVar2;
      local_34 = local_34 + 1;
    }
    local_34 = 0;
    while( true ) {
      bVar8 = false;
      if (local_34 < p->nObjs) {
        pFanin = Gia_ManObj(p,local_34);
        bVar8 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjIsAnd(pFanin);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pFanin);
        iVar3 = Gia_ObjFanin1Copy(pFanin);
        uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
        pFanin->Value = uVar2;
      }
      local_34 = local_34 + 1;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (local_34 < iVar1) {
        pFanin = Gia_ManCo(p,local_34);
        bVar8 = pFanin != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjFanin0Copy(pFanin);
      Gia_ManAppendCo(p_00,iVar1);
      local_34 = local_34 + 1;
    }
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    iVar1 = Vec_IntSize(p->vMapping);
    p_01 = Vec_IntAlloc(iVar1);
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFill(p_01,iVar1,0);
    for (local_34 = 1; iVar1 = Gia_ManObjNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Gia_ObjIsLut(p,local_34);
      if (iVar1 != 0) {
        pGVar5 = Gia_ManObj(p,local_34);
        iVar1 = Abc_Lit2Var(pGVar5->Value);
        iVar3 = Vec_IntSize(p_01);
        Vec_IntWriteEntry(p_01,iVar1,iVar3);
        iVar1 = Gia_ObjLutSize(p,local_34);
        Vec_IntPush(p_01,iVar1);
        for (local_38 = 0; iVar1 = Gia_ObjLutSize(p,local_34), local_38 < iVar1;
            local_38 = local_38 + 1) {
          piVar6 = Gia_ObjLutFanins(p,local_34);
          pGVar7 = Gia_ManObj(p,piVar6[local_38]);
          iVar1 = Abc_Lit2Var(pGVar7->Value);
          Vec_IntPush(p_01,iVar1);
        }
        iVar1 = Abc_Lit2Var(pGVar5->Value);
        Vec_IntPush(p_01,iVar1);
      }
    }
    p_00->vMapping = p_01;
    return p_00;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x929,"Gia_Man_t *Gia_ManDupHashMapping(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupHashMapping( Gia_Man_t * p )
{
    Gia_Man_t * pNew; 
    Vec_Int_t * vMapping; 
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Gia_ManHasMapping(p) );
    // copy the old manager with hashing
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // recreate mapping
    vMapping = Vec_IntAlloc( Vec_IntSize(p->vMapping) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( p, i )
    {
        pObj = Gia_ManObj( p, i );
        Vec_IntWriteEntry( vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFaninObj( p, i, pFanin, k )
            Vec_IntPush( vMapping, Abc_Lit2Var(pFanin->Value)  );
        Vec_IntPush( vMapping, Abc_Lit2Var(pObj->Value) );
    }
    pNew->vMapping = vMapping;
    return pNew;
}